

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O2

iterator * __thiscall
NNTreeImpl::insertFirst
          (iterator *__return_storage_ptr__,NNTreeImpl *this,QPDFObjectHandle *key,
          QPDFObjectHandle *value)

{
  QPDFObjectHandle *key_00;
  QPDF *qpdf;
  bool bVar1;
  undefined8 extraout_RAX;
  iterator parent;
  iterator result;
  iterator parent_00;
  allocator<char> local_79;
  QPDFObjectHandle items;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_58;
  string local_48;
  
  begin(__return_storage_ptr__,this);
  items.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  items.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  key_00 = &__return_storage_ptr__->node;
  bVar1 = QPDFObjectHandle::isDictionary(key_00);
  if (bVar1) {
    (*(code *)**(undefined8 **)this->details)();
    QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_48,(string *)key_00);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&items,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_48._M_string_length);
  }
  bVar1 = QPDFObjectHandle::isArray(&items);
  if (bVar1) {
    QPDFObjectHandle::insertItem(&items,0,key);
    QPDFObjectHandle::insertItem(&items,1,value);
    NNTreeIterator::setItemNumber(__return_storage_ptr__,key_00,0);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_58,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)key_00);
    parent_00._M_node = (_List_node_base *)&__return_storage_ptr__->path;
    parent._M_node = parent_00._M_node;
    if ((__return_storage_ptr__->path).
        super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>.
        _M_impl._M_node.super__List_node_base._M_next != parent_00._M_node) {
      parent._M_node =
           (__return_storage_ptr__->path).
           super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
           ._M_impl._M_node.super__List_node_base._M_prev;
    }
    NNTreeIterator::resetLimits(__return_storage_ptr__,(QPDFObjectHandle *)&local_58,parent);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_68,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)key_00);
    if ((__return_storage_ptr__->path).
        super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>.
        _M_impl._M_node.super__List_node_base._M_next != parent_00._M_node) {
      parent_00._M_node =
           (__return_storage_ptr__->path).
           super__List_base<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>
           ._M_impl._M_node.super__List_node_base._M_prev;
    }
    NNTreeIterator::split(__return_storage_ptr__,(QPDFObjectHandle *)&local_68,parent_00);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&items.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    return __return_storage_ptr__;
  }
  qpdf = this->qpdf;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"unable to find a valid items node",&local_79);
  ::error(qpdf,&this->oh,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&items.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  NNTreeIterator::~NNTreeIterator(__return_storage_ptr__);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

NNTreeImpl::iterator
NNTreeImpl::insertFirst(QPDFObjectHandle key, QPDFObjectHandle value)
{
    auto iter = begin();
    QPDFObjectHandle items;
    if (iter.node.isDictionary()) {
        items = iter.node.getKey(details.itemsKey());
    }
    if (!(items.isArray())) {
        QTC::TC("qpdf", "NNTree no valid items node in insertFirst");
        error(qpdf, this->oh, "unable to find a valid items node");
    }
    items.insertItem(0, key);
    items.insertItem(1, value);
    iter.setItemNumber(iter.node, 0);
    iter.resetLimits(iter.node, iter.lastPathElement());
    iter.split(iter.node, iter.lastPathElement());
    return iter;
}